

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

void destroy_stream(quicly_stream_t *stream,int err)

{
  uint8_t *puVar1;
  anon_struct_32_2_6d702f80_for_pending_link *paVar2;
  quicly_linklist_t *pqVar3;
  quicly_conn_t *conn;
  _func_void_void_ptr_char_ptr_varargs *p_Var4;
  kh_quicly_stream_t_t *h;
  khint64_t key;
  st_quicly_linklist_t *psVar5;
  st_quicly_linklist_t *psVar6;
  khint_t kVar7;
  uint uVar8;
  int iVar9;
  st_quicly_conn_streamgroup_state_t *psVar10;
  uint uVar11;
  
  conn = stream->conn;
  p_Var4 = (conn->super).tracer.cb;
  if (p_Var4 != (_func_void_void_ptr_char_ptr_varargs *)0x0) {
    (*p_Var4)((conn->super).tracer.ctx,
              "{\"type\":\"stream-on-destroy\", \"time\":%lld, \"stream-id\":%d, \"err\":%lld}\n",
              (conn->stash).now,(ulong)(uint)stream->stream_id,(long)err);
  }
  if (stream->callbacks != (quicly_stream_callbacks_t *)0x0) {
    (*stream->callbacks->on_destroy)(stream,err);
  }
  h = conn->streams;
  key = stream->stream_id;
  kVar7 = kh_get_quicly_stream_t(h,key);
  if (kVar7 != h->n_buckets) {
    uVar11 = h->flags[kVar7 >> 4];
    uVar8 = kVar7 * 2 & 0x1e;
    if ((uVar11 >> (sbyte)uVar8 & 3) == 0) {
      h->flags[kVar7 >> 4] = uVar11 | 1 << uVar8;
      h->size = h->size - 1;
    }
    if ((long)key < 0) {
      puVar1 = &(stream->conn->egress).pending_flows;
      *puVar1 = *puVar1 & ~(byte)(1 << (~(byte)key & 0x1f));
    }
    else {
      psVar10 = get_streamgroup_state(conn,key);
      psVar10->num_streams = psVar10->num_streams - 1;
    }
    quicly_sendstate_dispose(&stream->sendstate);
    quicly_recvstate_dispose(&stream->recvstate);
    paVar2 = &(stream->_send_aux).pending_link;
    psVar5 = (stream->_send_aux).pending_link.control.prev;
    psVar6 = (stream->_send_aux).pending_link.control.next;
    psVar5->next = psVar6;
    psVar6->prev = psVar5;
    (stream->_send_aux).pending_link.control.next = &paVar2->control;
    (stream->_send_aux).pending_link.control.prev = &paVar2->control;
    pqVar3 = &(stream->_send_aux).pending_link.default_scheduler;
    psVar5 = (stream->_send_aux).pending_link.default_scheduler.prev;
    psVar6 = (stream->_send_aux).pending_link.default_scheduler.next;
    psVar5->next = psVar6;
    psVar6->prev = psVar5;
    (stream->_send_aux).pending_link.default_scheduler.next = pqVar3;
    (stream->_send_aux).pending_link.default_scheduler.prev = pqVar3;
    if (conn->application != (st_quicly_application_space_t *)0x0) {
      uVar11 = 0;
      if (-1 < stream->stream_id) {
        uVar11 = (uint)((ulong)stream->stream_id >> 1) & 1;
      }
      iVar9 = should_send_max_streams(conn,uVar11);
      if (iVar9 != 0) {
        (conn->egress).send_ack_at = 0;
      }
    }
    free(stream);
    return;
  }
  __assert_fail("iter != kh_end(conn->streams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x462,"void destroy_stream(quicly_stream_t *, int)");
}

Assistant:

static void destroy_stream(quicly_stream_t *stream, int err)
{
    quicly_conn_t *conn = stream->conn;

    QUICLY_PROBE(STREAM_ON_DESTROY, conn, conn->stash.now, stream, err);

    if (stream->callbacks != NULL)
        stream->callbacks->on_destroy(stream, err);

    khiter_t iter = kh_get(quicly_stream_t, conn->streams, stream->stream_id);
    assert(iter != kh_end(conn->streams));
    kh_del(quicly_stream_t, conn->streams, iter);

    if (stream->stream_id < 0) {
        size_t epoch = -(1 + stream->stream_id);
        stream->conn->egress.pending_flows &= ~(uint8_t)(1 << epoch);
    } else {
        struct st_quicly_conn_streamgroup_state_t *group = get_streamgroup_state(conn, stream->stream_id);
        --group->num_streams;
    }

    dispose_stream_properties(stream);

    if (conn->application != NULL) {
        /* The function is normally invoked when receiving a packet, therefore just setting send_ack_at to zero is sufficient to
         * trigger the emission of the MAX_STREAMS frame. FWIW, the only case the function is invoked when not receiving a packet is
         * when the connection is being closed. In such case, the change will not have any bad side effects.
         */
        if (should_send_max_streams(conn, quicly_stream_is_unidirectional(stream->stream_id)))
            conn->egress.send_ack_at = 0;
    }

    free(stream);
}